

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::
~basic_memory_buffer(basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *this)

{
  buffer<unsigned_int> *in_RDI;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *unaff_retaddr;
  
  in_RDI->_vptr_buffer = (_func_int **)&PTR_grow_003e57b0;
  deallocate(unaff_retaddr);
  internal::buffer<unsigned_int>::~buffer(in_RDI);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x27c988);
  return;
}

Assistant:

~basic_memory_buffer() FMT_OVERRIDE { deallocate(); }